

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::draw_text(Fl_Text_Display *this,int left,int top,int width,int height)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  iVar2 = this->mMaxsize;
  iVar3 = (this->text_area).y;
  if (iVar2 == 0) {
    iVar2 = this->textsize_;
  }
  uVar1 = (long)((top - (iVar2 + iVar3)) + 1) / (long)iVar2;
  uVar4 = uVar1 & 0xffffffff;
  iVar2 = ((height + top) - iVar3) / iVar2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
            (fl_graphics_driver,left,top,(ulong)(uint)width);
  if ((int)uVar1 <= iVar2 + 1) {
    do {
      iVar3 = (int)uVar4;
      draw_vline(this,iVar3,left,width + left,0,0x7fffffff);
      uVar4 = (ulong)(iVar3 + 1);
    } while (iVar3 <= iVar2);
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Text_Display::draw_text( int left, int top, int width, int height ) {
  int fontHeight, firstLine, lastLine, line;

  /* find the line number range of the display */
  fontHeight = mMaxsize ? mMaxsize : textsize_;
  firstLine = ( top - text_area.y - fontHeight + 1 ) / fontHeight;
  lastLine = ( top + height - text_area.y ) / fontHeight + 1;

  fl_push_clip( left, top, width, height );

  /* draw the lines */
  for ( line = firstLine; line <= lastLine; line++ )
    draw_vline( line, left, left + width, 0, INT_MAX );

  fl_pop_clip();
}